

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  uint *puVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint *puVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint *puVar19;
  bool bVar20;
  char buffer [8];
  undefined8 local_38;
  int iVar18;
  
  if (bmi2 != 0) {
    sVar3 = FSE_readNCount_body_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,headerBuffer,hbSize);
    return sVar3;
  }
  if (hbSize < 8) {
    local_38 = 0;
    memcpy(&local_38,headerBuffer,hbSize);
    sVar4 = FSE_readNCount_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,&local_38,8,0);
    sVar3 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sVar3 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sVar3 = sVar4;
    }
  }
  else {
    uVar8 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar8 * 2);
    uVar11 = *headerBuffer & 0xf;
    sVar3 = 0xffffffffffffffd4;
    if (uVar11 < 0xb) {
      uVar16 = *headerBuffer >> 4;
      *tableLogPtr = uVar11 + 5;
      iVar15 = 0x20 << (sbyte)uVar11;
      uVar17 = iVar15 + 1;
      iVar12 = uVar11 + 6;
      puVar1 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar19 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar20 = true;
      uVar11 = 4;
      uVar14 = 0;
      puVar13 = (uint *)headerBuffer;
      do {
        if (!bVar20) {
          uVar7 = 0;
          if ((~uVar16 | 0x80000000) != 0) {
            for (; ((~uVar16 | 0x80000000) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
            }
          }
          while (0x17 < uVar7) {
            if (puVar1 < puVar13) {
              uVar11 = uVar11 + ((int)puVar13 - (int)puVar1) * 8 & 0x1f;
              puVar13 = puVar19;
            }
            else {
              puVar13 = (uint *)((long)puVar13 + 3);
            }
            uVar16 = *puVar13 >> ((byte)uVar11 & 0x1f);
            uVar7 = 0;
            if ((~uVar16 | 0x80000000) != 0) {
              for (; ((~uVar16 | 0x80000000) >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
              }
            }
            uVar14 = uVar14 + 0x24;
          }
          uVar16 = uVar16 >> ((byte)(uVar7 & 0xfffffffe) & 0x1f);
          uVar14 = (uVar16 & 3) + (uVar7 >> 1) * 3 + uVar14;
          uVar11 = uVar11 + (uVar7 & 0xfffffffe) + 2;
          if (uVar14 < uVar8) {
            iVar10 = (int)uVar11 >> 3;
            if ((puVar1 < puVar13) && (puVar19 < (uint *)((long)iVar10 + (long)puVar13))) {
              uVar11 = uVar11 + ((int)puVar13 - (int)puVar19) * 8 & 0x1f;
              puVar13 = puVar19;
            }
            else {
              uVar11 = uVar11 & 7;
              puVar13 = (uint *)((long)puVar13 + (long)iVar10);
            }
            uVar16 = *puVar13 >> (sbyte)uVar11;
          }
          if (uVar8 <= uVar14) break;
        }
        uVar7 = iVar15 * 2 - 1;
        uVar9 = uVar7 - uVar17;
        uVar5 = iVar15 - 1U & uVar16;
        if (uVar5 < uVar9) {
          iVar10 = iVar12 + -1;
        }
        else {
          uVar7 = uVar7 & uVar16;
          if ((int)uVar7 < iVar15) {
            uVar9 = 0;
          }
          uVar5 = uVar7 - uVar9;
          iVar10 = iVar12;
        }
        uVar11 = iVar10 + uVar11;
        iVar10 = uVar5 - 1;
        iVar18 = 1 - uVar5;
        if ((int)uVar5 < 1) {
          iVar18 = iVar10;
        }
        uVar17 = iVar18 + uVar17;
        uVar6 = (ulong)uVar14;
        uVar14 = uVar14 + 1;
        normalizedCounter[uVar6] = (short)iVar10;
        bVar20 = iVar10 != 0;
        if ((int)uVar17 < iVar15) {
          if (1 < (int)uVar17) {
            uVar7 = 0x1f;
            if (uVar17 != 0) {
              for (; uVar17 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            iVar12 = (uVar7 ^ 0xffffffe0) + 0x21;
            iVar15 = 1 << ((byte)uVar7 & 0x1f);
            goto LAB_0013de62;
          }
LAB_0013de86:
          bVar2 = false;
        }
        else {
LAB_0013de62:
          if (uVar8 <= uVar14) goto LAB_0013de86;
          iVar10 = (int)uVar11 >> 3;
          if ((puVar1 < puVar13) && (puVar19 < (uint *)((long)iVar10 + (long)puVar13))) {
            uVar11 = uVar11 + ((int)puVar13 - (int)puVar19) * 8 & 0x1f;
            puVar13 = puVar19;
          }
          else {
            uVar11 = uVar11 & 7;
            puVar13 = (uint *)((long)puVar13 + (long)iVar10);
          }
          uVar16 = *puVar13 >> (sbyte)uVar11;
          bVar2 = true;
        }
      } while (bVar2);
      sVar3 = 0xffffffffffffffec;
      if (((uVar17 == 1) && (sVar3 = 0xffffffffffffffd0, uVar14 <= uVar8)) &&
         (sVar3 = 0xffffffffffffffec, (int)uVar11 < 0x21)) {
        *maxSVPtr = uVar14 - 1;
        sVar3 = (long)puVar13 + ((long)((int)(uVar11 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar3;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}